

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O1

void __thiscall VectorsTest_Int3Equals_Test::TestBody(VectorsTest_Int3Equals_Test *this)

{
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8;
  
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(VectorsTest, Int3Equals)
{
    Int3 v1(13, 25, 21), v2(6, 8, 2);
    ASSERT_FALSE(v1 == v2);
    ASSERT_TRUE((v1 == v1) && (v2 == v2));
}